

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsIO.cpp
# Opt level: O0

void highsLogUser(HighsLogOptions *log_options_,HighsLogType type,char *format,...)

{
  ulong uVar1;
  char in_AL;
  bool bVar2;
  pointer pvVar3;
  size_type sVar4;
  char *__s;
  HighsCallbackDataOut *__args_2;
  undefined8 in_RCX;
  char *in_RDX;
  int in_ESI;
  long *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  HighsCallbackDataOut data_out;
  int l_1;
  int l;
  array<char,_1024UL> msgbuffer;
  size_t len;
  bool use_log_callback;
  bool flush_streams;
  va_list argptr;
  bool prefix;
  void *in_stack_fffffffffffff9d8;
  function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
  *in_stack_fffffffffffff9e0;
  anon_struct_16_2_bb6a87e9 *__args_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args_1;
  int in_stack_fffffffffffff9fc;
  function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
  *in_stack_fffffffffffffa00;
  byte local_5db;
  byte local_5da;
  bool local_5d9;
  undefined1 local_5d8 [24];
  undefined8 local_5c0;
  undefined8 local_5b8;
  undefined8 local_5b0;
  undefined8 local_5a8;
  undefined8 local_598;
  undefined8 local_588;
  undefined8 local_578;
  undefined8 local_568;
  undefined8 local_558;
  undefined8 local_548;
  undefined8 local_538;
  undefined1 local_509 [33];
  int local_4e8;
  int local_450;
  int local_44c;
  array<char,_1024UL> local_448;
  ulong local_48;
  byte local_3a;
  undefined1 local_39;
  undefined4 local_38;
  undefined4 local_34;
  undefined1 *local_30;
  undefined1 *local_28;
  bool local_19;
  char *local_18;
  int local_c;
  long *local_8;
  
  if (in_AL != '\0') {
    local_5a8 = in_XMM0_Qa;
    local_598 = in_XMM1_Qa;
    local_588 = in_XMM2_Qa;
    local_578 = in_XMM3_Qa;
    local_568 = in_XMM4_Qa;
    local_558 = in_XMM5_Qa;
    local_548 = in_XMM6_Qa;
    local_538 = in_XMM7_Qa;
  }
  if (((*(byte *)in_RDI[1] & 1) != 0) && ((*in_RDI != 0 || ((*(byte *)in_RDI[2] & 1) != 0)))) {
    local_5d9 = in_ESI == 4 || in_ESI == 5;
    local_19 = local_5d9;
    local_28 = local_5d8;
    local_30 = &stack0x00000008;
    local_34 = 0x30;
    local_38 = 0x18;
    local_39 = 1;
    local_5da = 1;
    local_5c0 = in_RCX;
    local_5b8 = in_R8;
    local_5b0 = in_R9;
    local_18 = in_RDX;
    local_c = in_ESI;
    local_8 = in_RDI;
    if (in_RDI[4] == 0) {
      bVar2 = std::function::operator_cast_to_bool(in_stack_fffffffffffff9e0);
      local_5db = 0;
      if (bVar2) {
        local_5db = *(byte *)(local_8 + 0xb);
      }
      local_5da = local_5db;
    }
    local_3a = local_5da & 1;
    if (local_3a == 0) {
      if (*local_8 != 0) {
        if ((local_19 & 1U) != 0) {
          fprintf((FILE *)*local_8,"%-9s",HighsLogTypeTag[local_c]);
        }
        vfprintf((FILE *)*local_8,local_18,&local_38);
        fflush((FILE *)*local_8);
        local_28 = local_5d8;
        local_30 = &stack0x00000008;
        local_34 = 0x30;
        local_38 = 0x18;
      }
      if (((*(byte *)local_8[2] & 1) != 0) && ((FILE *)*local_8 != _stdout)) {
        if ((local_19 & 1U) != 0) {
          fprintf(_stdout,"%-9s",HighsLogTypeTag[local_c]);
        }
        vfprintf(_stdout,local_18,&local_38);
        fflush(_stdout);
      }
    }
    else {
      local_48 = 0;
      memset(&local_448,0,0x400);
      if ((local_19 & 1U) != 0) {
        pvVar3 = std::array<char,_1024UL>::data((array<char,_1024UL> *)0x45ad1c);
        sVar4 = std::array<char,_1024UL>::size(&local_448);
        local_44c = snprintf(pvVar3,sVar4,"%-9s",HighsLogTypeTag[local_c]);
        local_48 = (ulong)local_44c;
      }
      uVar1 = local_48;
      sVar4 = std::array<char,_1024UL>::size(&local_448);
      if (uVar1 < sVar4) {
        pvVar3 = std::array<char,_1024UL>::data((array<char,_1024UL> *)0x45ada2);
        __s = pvVar3 + local_48;
        sVar4 = std::array<char,_1024UL>::size(&local_448);
        local_450 = vsnprintf(__s,sVar4 - local_48,local_18,&local_38);
        local_48 = (long)local_450 + local_48;
      }
      if (local_8[4] != 0) {
        in_stack_fffffffffffffa00 =
             (function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
              *)local_8[4];
        in_stack_fffffffffffff9fc = local_c;
        pvVar3 = std::array<char,_1024UL>::data((array<char,_1024UL> *)0x45ae38);
        (*(code *)in_stack_fffffffffffffa00)(in_stack_fffffffffffff9fc,pvVar3,local_8[5]);
      }
      if ((*(byte *)(local_8 + 0xb) & 1) != 0) {
        local_4e8 = local_c;
        __args_3 = (anon_struct_16_2_bb6a87e9 *)(local_8 + 6);
        __args_2 = (HighsCallbackDataOut *)
                   std::array<char,_1024UL>::data((array<char,_1024UL> *)0x45ae90);
        __args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_509;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)(local_509 + 1),(char *)__args_2,(allocator *)__args_1);
        std::
        function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
        ::operator()(in_stack_fffffffffffffa00,in_stack_fffffffffffff9fc,__args_1,__args_2,__args_3,
                     in_stack_fffffffffffff9d8);
        std::__cxx11::string::~string((string *)(local_509 + 1));
        std::allocator<char>::~allocator((allocator<char> *)local_509);
      }
    }
  }
  return;
}

Assistant:

void highsLogUser(const HighsLogOptions& log_options_, const HighsLogType type,
                  const char* format, ...) {
  if (!*log_options_.output_flag ||
      (log_options_.log_stream == NULL && !*log_options_.log_to_console))
    return;
  // highsLogUser should not be passed HighsLogType::kDetailed or
  // HighsLogType::kVerbose
  assert(type != HighsLogType::kDetailed);
  assert(type != HighsLogType::kVerbose);
  const bool prefix =
      type == HighsLogType::kWarning || type == HighsLogType::kError;
  va_list argptr;
  va_start(argptr, format);
  const bool flush_streams = true;
  const bool use_log_callback =
      log_options_.user_log_callback ||
      (log_options_.user_callback && log_options_.user_callback_active);

  if (!use_log_callback) {
    // Write to log file stream unless it is NULL
    if (log_options_.log_stream) {
      if (prefix)
        fprintf(log_options_.log_stream, "%-9s", HighsLogTypeTag[(int)type]);
      vfprintf(log_options_.log_stream, format, argptr);
      if (flush_streams) fflush(log_options_.log_stream);
      va_end(argptr);
      va_start(argptr, format);
    }
    // Write to stdout unless log file stream is stdout
    if (*log_options_.log_to_console && log_options_.log_stream != stdout) {
      if (prefix) fprintf(stdout, "%-9s", HighsLogTypeTag[(int)type]);
      vfprintf(stdout, format, argptr);
      if (flush_streams) fflush(stdout);
    }
  } else {
    size_t len = 0;
    std::array<char, kIoBufferSize> msgbuffer = {};
    if (prefix) {
      int l = snprintf(msgbuffer.data(), msgbuffer.size(), "%-9s",
                       HighsLogTypeTag[(int)type]);
      // assert that there are no encoding errors
      assert(l >= 0);
      len = static_cast<size_t>(l);
    }
    if (len < msgbuffer.size()) {
      int l = vsnprintf(msgbuffer.data() + len, msgbuffer.size() - len, format,
                        argptr);
      // assert that there are no encoding errors
      assert(l >= 0);
      len += static_cast<size_t>(l);
    }
    if (log_options_.user_log_callback) {
      log_options_.user_log_callback(type, msgbuffer.data(),
                                     log_options_.user_log_callback_data);
    }
    if (log_options_.user_callback_active) {
      assert(log_options_.user_callback);
      HighsCallbackDataOut data_out;
      data_out.log_type = int(type);
      log_options_.user_callback(kCallbackLogging, msgbuffer.data(), &data_out,
                                 nullptr, log_options_.user_callback_data);
    }
  }
  va_end(argptr);
}